

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcolumn_dfs.c
# Opt level: O1

int dcolumn_dfs(int m,int jcol,int *perm_r,int *nseg,int *lsub_col,int *segrep,int *repfnz,
               int_t *xprune,int *marker,int *parent,int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int_t *piVar4;
  int_t iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int next;
  int_t *piVar11;
  int iVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  int *piVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int_t local_98;
  int local_94;
  int_t *local_90;
  int local_84;
  long local_80;
  long local_78;
  int *local_70;
  int *local_68;
  int *local_60;
  long local_58;
  int local_4c;
  ulong local_48;
  int *local_40;
  int *local_38;
  
  uVar19 = (ulong)(uint)jcol;
  local_68 = Glu->xsup;
  piVar3 = Glu->supno;
  piVar11 = Glu->lsub;
  piVar4 = Glu->xlsub;
  local_98 = Glu->nzlmax;
  local_60 = perm_r;
  local_40 = nseg;
  local_38 = segrep;
  local_4c = sp_ienv(3);
  iVar12 = jcol + -1;
  local_80 = (long)jcol;
  iVar9 = piVar3[local_80];
  next = piVar4[local_80];
  iVar6 = *lsub_col;
  piVar16 = local_68;
  iVar15 = iVar9;
  local_90 = piVar4;
  if (iVar6 != -1) {
    local_78 = 0;
    piVar13 = local_60;
    local_84 = iVar12;
    local_70 = lsub_col;
    local_48 = uVar19;
    do {
      lsub_col[local_78] = -1;
      iVar10 = marker[(long)(m * 2) + (long)iVar6];
      iVar17 = (int)uVar19;
      if (iVar10 != iVar17) {
        marker[(long)(m * 2) + (long)iVar6] = iVar17;
        iVar18 = piVar13[iVar6];
        if ((long)iVar18 == -1) {
          lVar7 = (long)next;
          next = next + 1;
          piVar11[lVar7] = iVar6;
          if (local_98 <= next) {
            iVar5 = dLUMemXpand(iVar17,next,LSUB,&local_98,Glu);
            if (iVar5 != 0) {
              return iVar5;
            }
            piVar11 = Glu->lsub;
            lsub_col = local_70;
            piVar13 = local_60;
            uVar19 = local_48;
            iVar12 = local_84;
          }
          if (iVar10 != iVar12) {
            iVar15 = -1;
          }
        }
        else {
          lVar7 = (long)piVar16[(long)piVar3[iVar18] + 1];
          if (repfnz[lVar7 + -1] == -1) {
            lVar14 = lVar7 + -1;
            parent[lVar7 + -1] = -1;
            repfnz[lVar7 + -1] = iVar18;
            piVar8 = local_90 + lVar14;
            local_94 = iVar15;
            while( true ) {
              iVar6 = *piVar8;
              iVar15 = xprune[lVar14];
              while (local_58 = lVar14, iVar6 < iVar15) {
                iVar10 = piVar11[iVar6];
                iVar6 = iVar6 + 1;
                iVar17 = marker[(long)(m * 2) + (long)iVar10];
                iVar18 = (int)uVar19;
                lVar14 = local_58;
                if (iVar17 != iVar18) {
                  marker[(long)(m * 2) + (long)iVar10] = iVar18;
                  iVar1 = piVar13[iVar10];
                  if ((long)iVar1 == -1) {
                    lVar7 = (long)next;
                    next = next + 1;
                    piVar11[lVar7] = iVar10;
                    if (local_98 <= next) {
                      iVar5 = dLUMemXpand(iVar18,next,LSUB,&local_98,Glu);
                      if (iVar5 != 0) {
                        return iVar5;
                      }
                      piVar11 = Glu->lsub;
                      piVar13 = local_60;
                      piVar16 = local_68;
                      uVar19 = local_48;
                      iVar12 = local_84;
                    }
                    lVar14 = local_58;
                    if (iVar17 != iVar12) {
                      local_94 = -1;
                    }
                  }
                  else {
                    lVar7 = (long)piVar16[(long)piVar3[iVar1] + 1];
                    if (repfnz[lVar7 + -1] == -1) {
                      xplore[(int)local_58] = iVar6;
                      parent[lVar7 + -1] = (int)local_58;
                      repfnz[lVar7 + -1] = iVar1;
                      iVar6 = local_90[lVar7 + -1];
                      iVar15 = xprune[lVar7 + -1];
                      lVar14 = lVar7 + -1;
                    }
                    else if (iVar1 < repfnz[lVar7 + -1]) {
                      repfnz[lVar7 + -1] = iVar1;
                    }
                  }
                }
              }
              local_38[*local_40] = (int)local_58;
              *local_40 = *local_40 + 1;
              lVar14 = (long)parent[(int)local_58];
              lsub_col = local_70;
              iVar15 = local_94;
              if (lVar14 == -1) break;
              piVar8 = xplore + lVar14;
            }
          }
          else if (iVar18 < repfnz[lVar7 + -1]) {
            repfnz[lVar7 + -1] = iVar18;
          }
        }
      }
      jcol = (int)uVar19;
      iVar6 = lsub_col[local_78 + 1];
      local_78 = local_78 + 1;
    } while (iVar6 != -1);
  }
  iVar6 = jcol + 1;
  if (jcol == 0) {
    *piVar3 = 0;
    iVar9 = 0;
  }
  else {
    iVar10 = piVar16[iVar9];
    iVar17 = local_90[local_80];
    uVar2 = local_90[iVar12];
    if (((local_4c <= jcol - iVar10) || (next - iVar17 != ~uVar2 + iVar17)) || (iVar15 == -1)) {
      iVar15 = next;
      if (iVar10 < jcol + -2) {
        iVar15 = local_90[(long)iVar10 + 1];
        local_90[iVar12] = iVar15;
        iVar10 = (iVar17 - uVar2) + iVar15;
        xprune[iVar12] = iVar10;
        local_90[local_80] = iVar10;
        if ((int)uVar2 < next) {
          lVar7 = 0;
          do {
            piVar11[iVar15 + lVar7] = piVar11[(int)uVar2 + lVar7];
            lVar7 = lVar7 + 1;
          } while ((long)next - (long)(int)uVar2 != lVar7);
          iVar15 = (int)lVar7 + iVar15;
        }
      }
      next = iVar15;
      iVar9 = iVar9 + 1;
      piVar3[local_80] = iVar9;
    }
  }
  piVar16[(long)iVar9 + 1] = iVar6;
  piVar3[iVar6] = iVar9;
  xprune[local_80] = next;
  local_90[iVar6] = next;
  return 0;
}

Assistant:

int
dcolumn_dfs(
	   const int  m,         /* in - number of rows in the matrix */
	   const int  jcol,      /* in */
	   int        *perm_r,   /* in */
	   int        *nseg,     /* modified - with new segments appended */
	   int        *lsub_col, /* in - defines the RHS vector to start the dfs */
	   int        *segrep,   /* modified - with new segments appended */
	   int        *repfnz,   /* modified */
	   int_t      *xprune,   /* modified */
	   int        *marker,   /* modified */
	   int        *parent,	 /* working array */
	   int_t      *xplore,   /* working array */
	   GlobalLU_t *Glu       /* modified */
	   )
{

    int     jcolp1, jcolm1, jsuper, nsuper;
    int     krep, krow, kmark, kperm;
    int     *marker2;           /* Used for small panel LU */
    int	    fsupc;		/* First column of a snode */
    int     myfnz;		/* First nonz column of a U-segment */
    int	    chperm, chmark, chrep, kchild;
    int_t   xdfs, maxdfs, nextl, k;
    int     kpar, oldrep;
    int_t   jptr, jm1ptr;
    int_t   ito, ifrom, istop;	/* Used to compress row subscripts */
    int     *xsup, *supno;
    int_t   *lsub, *xlsub;
    int_t   nzlmax, mem_error;
    int     maxsuper;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    maxsuper = sp_ienv(3);
    jcolp1  = jcol + 1;
    jcolm1  = jcol - 1;
    nsuper  = supno[jcol];
    jsuper  = nsuper;
    nextl   = xlsub[jcol];
    marker2 = &marker[2*m];

    /* For each nonzero in A[*,jcol] do dfs */
    for (k = 0; lsub_col[k] != SLU_EMPTY; k++) {

	krow = lsub_col[k];
    	lsub_col[k] = SLU_EMPTY;
	kmark = marker2[krow];    	

	/* krow was visited before, go to the next nonz */
        if ( kmark == jcol ) continue; 

	/* For each unmarked nbr krow of jcol
	 *	krow is in L: place it in structure of L[*,jcol]
	 */
	marker2[krow] = jcol;
	kperm = perm_r[krow];

   	if ( kperm == SLU_EMPTY ) {
	    lsub[nextl++] = krow; 	/* krow is indexed into A */
	    if ( nextl >= nzlmax ) {
		mem_error = dLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		if ( mem_error ) return (mem_error);
		lsub = Glu->lsub;
	    }
            if ( kmark != jcolm1 ) jsuper = SLU_EMPTY;/* Row index subset testing */
  	} else {
	    /*	krow is in U: if its supernode-rep krep
	     *	has been explored, update repfnz[*]
	     */
	    krep = xsup[supno[kperm]+1] - 1;
	    myfnz = repfnz[krep];

	    if ( myfnz != SLU_EMPTY ) {	/* Visited before */
	    	if ( myfnz > kperm ) repfnz[krep] = kperm;
		/* continue; */
	    }
	    else {
		/* Otherwise, perform dfs starting at krep */
		oldrep = SLU_EMPTY;
	 	parent[krep] = oldrep;
	  	repfnz[krep] = kperm;
		xdfs = xlsub[krep];
	  	maxdfs = xprune[krep];

		do {
		    /* 
		     * For each unmarked kchild of krep 
		     */
		    while ( xdfs < maxdfs ) {

		   	kchild = lsub[xdfs];
			xdfs++;
		  	chmark = marker2[kchild];

		   	if ( chmark != jcol ) { /* Not reached yet */
		   	    marker2[kchild] = jcol;
		   	    chperm = perm_r[kchild];

		   	    /* Case kchild is in L: place it in L[*,k] */
		   	    if ( chperm == SLU_EMPTY ) {
			    	lsub[nextl++] = kchild;
				if ( nextl >= nzlmax ) {
				    mem_error =
					 dLUMemXpand(jcol,nextl,LSUB,&nzlmax,Glu);
				    if ( mem_error ) return (mem_error);
				    lsub = Glu->lsub;
				}
				if ( chmark != jcolm1 ) jsuper = SLU_EMPTY;
			    } else {
		    	    	/* Case kchild is in U: 
				 *   chrep = its supernode-rep. If its rep has 
			         *   been explored, update its repfnz[*]
			         */
		   	    	chrep = xsup[supno[chperm]+1] - 1;
		   		myfnz = repfnz[chrep];
		   		if ( myfnz != SLU_EMPTY ) { /* Visited before */
				    if ( myfnz > chperm )
     				  	repfnz[chrep] = chperm;
				} else {
		        	    /* Continue dfs at super-rep of kchild */
		   		    xplore[krep] = xdfs;	
		   		    oldrep = krep;
		   		    krep = chrep; /* Go deeper down G(L^t) */
				    parent[krep] = oldrep;
		    		    repfnz[krep] = chperm;
		   		    xdfs = xlsub[krep];     
				    maxdfs = xprune[krep];
				} /* else */

			   } /* else */

			} /* if */

		    } /* while */

		    /* krow has no more unexplored nbrs;
	   	     *    place supernode-rep krep in postorder DFS.
	   	     *    backtrack dfs to its parent
		     */
		    segrep[*nseg] = krep;
		    ++(*nseg);
		    kpar = parent[krep]; /* Pop from stack, mimic recursion */
		    if ( kpar == SLU_EMPTY ) break; /* dfs done */
		    krep = kpar;
		    xdfs = xplore[krep];
		    maxdfs = xprune[krep];

		} while ( kpar != SLU_EMPTY ); 	/* Until empty stack */

	    } /* else */

	} /* else */

    } /* for each nonzero ... */

    /* Check to see if j belongs in the same supernode as j-1 */
    if ( jcol == 0 ) { /* Do nothing for column 0 */
	nsuper = supno[0] = 0;
    } else {
   	fsupc = xsup[nsuper];
	jptr = xlsub[jcol];	/* Not compressed yet */
	jm1ptr = xlsub[jcolm1];

#ifdef T2_SUPER
	if ( (nextl-jptr != jptr-jm1ptr-1) ) jsuper = SLU_EMPTY;
#endif
	/* Make sure the number of columns in a supernode doesn't
	   exceed threshold. */
	if ( jcol - fsupc >= maxsuper ) jsuper = SLU_EMPTY;

	/* If jcol starts a new supernode, reclaim storage space in
	 * lsub from the previous supernode. Note we only store
	 * the subscript set of the first and last columns of
   	 * a supernode. (first for num values, last for pruning)
	 */
	if ( jsuper == SLU_EMPTY ) {	/* starts a new supernode */
	    if ( (fsupc < jcolm1-1) ) {	/* >= 3 columns in nsuper */
#ifdef CHK_COMPRESS
		printf("  Compress lsub[] at super %d-%d\n", fsupc, jcolm1);
#endif
	        ito = xlsub[fsupc+1];
		xlsub[jcolm1] = ito;
		istop = ito + jptr - jm1ptr;
		xprune[jcolm1] = istop; /* Initialize xprune[jcol-1] */
		xlsub[jcol] = istop;
		for (ifrom = jm1ptr; ifrom < nextl; ++ifrom, ++ito)
		    lsub[ito] = lsub[ifrom];
		nextl = ito;            /* = istop + length(jcol) */
	    }
	    nsuper++;
	    supno[jcol] = nsuper;
	} /* if a new supernode */

    }	/* else: jcol > 0 */ 
    
    /* Tidy up the pointers before exit */
    xsup[nsuper+1] = jcolp1;
    supno[jcolp1]  = nsuper;
    xprune[jcol]   = nextl;	/* Initialize upper bound for pruning */
    xlsub[jcolp1]  = nextl;

    return 0;
}